

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O0

group * __thiscall mpt::convertable::operator_cast_to_group_(convertable *this)

{
  int iVar1;
  convertable *local_28;
  group *ptr;
  convertable *pcStack_18;
  int type;
  convertable *this_local;
  
  pcStack_18 = this;
  ptr._4_4_ = type_properties<mpt::group_*>::id(true);
  local_28 = (convertable *)0x0;
  if ((0 < ptr._4_4_) &&
     (iVar1 = (**this->_vptr_convertable)(this,(long)ptr._4_4_,&local_28), -1 < iVar1)) {
    return (group *)local_28;
  }
  return (group *)0x0;
}

Assistant:

mpt::convertable::operator T *()
{
	int type = mpt::type_properties<T *>::id(true);
	T *ptr = 0;
	if ((type <= 0) || (convert(type, &ptr) < 0)) {
		return 0;
	}
	return ptr;
}